

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O0

void __thiscall
burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
increment(subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          *this)

{
  iterator iVar1;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> _Var2;
  difference_type dVar3;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  new_subsequence_end;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  *this_local;
  
  iVar1 = subsequence_begin(this);
  _Var2 = subsequence_end(this);
  _Var2 = next_subsequence<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*>
                    (iVar1._M_current,_Var2,this->m_begin,this->m_end);
  iVar1 = subsequence_begin(this);
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>>
                    ((__normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                      )iVar1._M_current,_Var2);
  this->m_subsequence_size = dVar3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subsequence_end =
                next_subsequence(subsequence_begin(), subsequence_end(), m_begin, m_end);
            m_subsequence_size = std::distance(subsequence_begin(), new_subsequence_end);
        }